

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

uintmax_t anon_unknown.dwarf_59d9::remove_all_aux(path *p,file_type type,error_code *ec)

{
  uintmax_t uVar1;
  uintmax_t uVar2;
  directory_iterator itr;
  directory_iterator local_40;
  file_type local_30 [2];
  
  if (type == directory_file) {
    boost::filesystem::directory_iterator::directory_iterator(&local_40,p);
    uVar2 = 1;
    while (local_40.m_imp.px != (anonymous_namespace)::end_dir_itr) {
      if (local_40.m_imp.px == (element_type *)0x0) {
LAB_0010d390:
        __assert_fail("(m_imp.get())&&(\"attempt to dereference end iterator\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/filesystem/operations.hpp"
                      ,0x3a7,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
      boost::filesystem::detail::symlink_status((detail *)local_30,(path *)local_40.m_imp.px,ec);
      if ((ec != (error_code *)0x0) && (ec->m_val != 0)) {
        boost::detail::shared_count::~shared_count(&local_40.m_imp.pn);
        return uVar2;
      }
      if (local_40.m_imp.px == (element_type *)0x0) goto LAB_0010d390;
      uVar1 = remove_all_aux((path *)local_40.m_imp.px,local_30[0],ec);
      uVar2 = uVar2 + uVar1;
      boost::filesystem::detail::directory_iterator_increment(&local_40,(error_code *)0x0);
    }
    boost::detail::shared_count::~shared_count(&local_40.m_imp.pn);
    remove_file_or_directory(p,directory_file,ec);
  }
  else {
    remove_file_or_directory(p,type,ec);
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

boost::uintmax_t remove_all_aux(const path& p, fs::file_type type,
    error_code* ec)
  {
    boost::uintmax_t count = 1;

    if (type == fs::directory_file)  // but not a directory symlink
    {
      for (fs::directory_iterator itr(p);
            itr != end_dir_itr; ++itr)
      {
        fs::file_type tmp_type = query_file_type(itr->path(), ec);
        if (ec != 0 && *ec)
          return count;
        count += remove_all_aux(itr->path(), tmp_type, ec);
      }
    }
    remove_file_or_directory(p, type, ec);
    return count;
  }